

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlCopyChar(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined4 local_3c;
  undefined8 uStack_38;
  int val;
  xmlChar *out;
  int len;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlCopyChar");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT
                      (py_retval,"izi:xmlCopyChar",&out,&stack0xffffffffffffffc8,&local_3c);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      out._4_4_ = xmlCopyChar(out._0_4_,uStack_38,local_3c);
      self_local = libxml_intWrap(out._4_4_);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlCopyChar(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    int len;
    xmlChar * out;
    int val;

    if (libxml_deprecationWarning("xmlCopyChar") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"izi:xmlCopyChar", &len, &out, &val))
        return(NULL);

    c_retval = xmlCopyChar(len, out, val);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}